

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaParseIncludeOrRedefine
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node,int type)

{
  int iVar1;
  bool bVar2;
  xmlSchemaBucketPtr_conflict local_58;
  xmlSchemaBucketPtr_conflict bucket;
  int local_48;
  int wasChameleon;
  int isChameleon;
  int res;
  xmlChar *schemaLocation;
  xmlNodePtr child;
  xmlNodePtr pxStack_28;
  int type_local;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  schemaLocation = (xmlChar *)0x0;
  _isChameleon = (xmlChar *)0x0;
  wasChameleon = 0;
  local_48 = 0;
  bucket._4_4_ = 0;
  local_58 = (xmlSchemaBucketPtr_conflict)0x0;
  if (((pctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    return -1;
  }
  child._4_4_ = type;
  pxStack_28 = node;
  node_local = (xmlNodePtr)schema;
  schema_local = (xmlSchemaPtr)pctxt;
  wasChameleon = xmlSchemaParseIncludeOrRedefineAttrs
                           (pctxt,schema,node,(xmlChar **)&isChameleon,type);
  if (wasChameleon != 0) {
    return wasChameleon;
  }
  wasChameleon = xmlSchemaAddSchemaDoc
                           ((xmlSchemaParserCtxtPtr)schema_local,child._4_4_,_isChameleon,
                            (xmlDocPtr)0x0,(char *)0x0,0,pxStack_28,(xmlChar *)schema_local[1].annot
                            ,(xmlChar *)0x0,&local_58);
  if (wasChameleon != 0) {
    return wasChameleon;
  }
  if ((local_58 == (xmlSchemaBucketPtr_conflict)0x0) || (local_58->doc == (xmlDocPtr)0x0)) {
    if (child._4_4_ == 2) {
      wasChameleon = 0xbea;
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)schema_local,XML_SCHEMAP_SRC_INCLUDE,pxStack_28,
                         (xmlSchemaBasicItemPtr)0x0,
                         "Failed to load the document \'%s\' for inclusion",_isChameleon,
                         (xmlChar *)0x0);
    }
    else {
      wasChameleon = 0xc09;
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)schema_local,XML_SCHEMAP_SRC_REDEFINE,pxStack_28,
                         (xmlSchemaBasicItemPtr)0x0,
                         "Failed to load the document \'%s\' for redefinition",_isChameleon,
                         (xmlChar *)0x0);
    }
  }
  else if (local_58->origTargetNamespace == (xmlChar *)0x0) {
    if (schema_local[1].annot != (xmlSchemaAnnotPtr)0x0) {
      local_48 = 1;
      if ((local_58->parsed != 0) && (local_58->origTargetNamespace != (xmlChar *)0x0)) {
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)schema_local,XML_SCHEMAP_SRC_INCLUDE,pxStack_28
                           ,(xmlSchemaBasicItemPtr)0x0,
                           "The target namespace of the included/redefined schema \'%s\' has to be absent or the same as the including/redefining schema\'s target namespace"
                           ,_isChameleon,(xmlChar *)0x0);
        goto LAB_0020effe;
      }
      local_58->targetNamespace = (xmlChar *)schema_local[1].annot;
    }
  }
  else {
    if (schema_local[1].annot == (xmlSchemaAnnotPtr)0x0) {
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)schema_local,XML_SCHEMAP_SRC_INCLUDE,pxStack_28,
                         (xmlSchemaBasicItemPtr)0x0,
                         "The target namespace of the included/redefined schema \'%s\' has to be absent, since the including/redefining schema has no target namespace"
                         ,_isChameleon,(xmlChar *)0x0);
LAB_0020effe:
      return *(int *)&schema_local->doc;
    }
    iVar1 = xmlStrEqual(local_58->origTargetNamespace,(xmlChar *)schema_local[1].annot);
    if (iVar1 == 0) {
      xmlSchemaPCustomErrExt
                ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_SRC_INCLUDE,
                 (xmlSchemaBasicItemPtr)0x0,pxStack_28,
                 "The target namespace \'%s\' of the included/redefined schema \'%s\' differs from \'%s\' of the including/redefining schema"
                 ,local_58->origTargetNamespace,_isChameleon,(xmlChar *)schema_local[1].annot);
      goto LAB_0020effe;
    }
  }
  if (((local_58 != (xmlSchemaBucketPtr_conflict)0x0) && (local_58->parsed == 0)) &&
     (local_58->doc != (xmlDocPtr)0x0)) {
    if (local_48 != 0) {
      if (((ulong)node_local->next & 0x200) == 0) {
        *(uint *)&node_local->next = *(uint *)&node_local->next | 0x200;
      }
      else {
        bucket._4_4_ = 1;
      }
    }
    xmlSchemaParseNewDoc((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,local_58);
    if ((local_48 != 0) && (bucket._4_4_ == 0)) {
      *(uint *)&node_local->next = *(uint *)&node_local->next ^ 0x200;
    }
  }
  schemaLocation = (xmlChar *)pxStack_28->children;
  if (child._4_4_ == 3) {
    *(xmlSchemaBucketPtr_conflict *)&schema_local[1].flags = local_58;
    *(undefined4 *)((long)&schema_local[1].id + 4) = 1;
    do {
      if (((schemaLocation == (xmlChar *)0x0) || (*(long *)(schemaLocation + 0x48) == 0)) ||
         (iVar1 = xmlStrEqual(*(xmlChar **)(schemaLocation + 0x10),"annotation"), iVar1 == 0)) {
LAB_0020ebd7:
        if (((schemaLocation != (xmlChar *)0x0) && (*(long *)(schemaLocation + 0x48) != 0)) &&
           (iVar1 = xmlStrEqual(*(xmlChar **)(schemaLocation + 0x10),"simpleType"), iVar1 != 0)) {
          iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),xmlSchemaNs);
          bVar2 = true;
          if (iVar1 != 0) goto LAB_0020ed2f;
        }
        if (((schemaLocation != (xmlChar *)0x0) && (*(long *)(schemaLocation + 0x48) != 0)) &&
           (iVar1 = xmlStrEqual(*(xmlChar **)(schemaLocation + 0x10),(xmlChar *)"complexType"),
           iVar1 != 0)) {
          iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),xmlSchemaNs);
          bVar2 = true;
          if (iVar1 != 0) goto LAB_0020ed2f;
        }
        if (((schemaLocation != (xmlChar *)0x0) && (*(long *)(schemaLocation + 0x48) != 0)) &&
           (iVar1 = xmlStrEqual(*(xmlChar **)(schemaLocation + 0x10),"group"), iVar1 != 0)) {
          iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),xmlSchemaNs);
          bVar2 = true;
          if (iVar1 != 0) goto LAB_0020ed2f;
        }
        bVar2 = false;
        if ((schemaLocation != (xmlChar *)0x0) &&
           (bVar2 = false, *(long *)(schemaLocation + 0x48) != 0)) {
          iVar1 = xmlStrEqual(*(xmlChar **)(schemaLocation + 0x10),(xmlChar *)"attributeGroup");
          bVar2 = false;
          if (iVar1 != 0) {
            iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),xmlSchemaNs);
            bVar2 = iVar1 != 0;
          }
        }
      }
      else {
        iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),xmlSchemaNs);
        bVar2 = true;
        if (iVar1 == 0) goto LAB_0020ebd7;
      }
LAB_0020ed2f:
      if (!bVar2) goto LAB_0020ef1b;
      if ((((schemaLocation == (xmlChar *)0x0) || (*(long *)(schemaLocation + 0x48) == 0)) ||
          (iVar1 = xmlStrEqual(*(xmlChar **)(schemaLocation + 0x10),"annotation"), iVar1 == 0)) ||
         (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),xmlSchemaNs),
         iVar1 == 0)) {
        if (((schemaLocation == (xmlChar *)0x0) || (*(long *)(schemaLocation + 0x48) == 0)) ||
           ((iVar1 = xmlStrEqual(*(xmlChar **)(schemaLocation + 0x10),"simpleType"), iVar1 == 0 ||
            (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),xmlSchemaNs)
            , iVar1 == 0)))) {
          if (((schemaLocation == (xmlChar *)0x0) || (*(long *)(schemaLocation + 0x48) == 0)) ||
             ((iVar1 = xmlStrEqual(*(xmlChar **)(schemaLocation + 0x10),(xmlChar *)"complexType"),
              iVar1 == 0 ||
              (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),
                                   xmlSchemaNs), iVar1 == 0)))) {
            if ((((schemaLocation == (xmlChar *)0x0) || (*(long *)(schemaLocation + 0x48) == 0)) ||
                (iVar1 = xmlStrEqual(*(xmlChar **)(schemaLocation + 0x10),"group"), iVar1 == 0)) ||
               (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),
                                    xmlSchemaNs), iVar1 == 0)) {
              if (((schemaLocation != (xmlChar *)0x0) && (*(long *)(schemaLocation + 0x48) != 0)) &&
                 ((iVar1 = xmlStrEqual(*(xmlChar **)(schemaLocation + 0x10),
                                       (xmlChar *)"attributeGroup"), iVar1 != 0 &&
                  (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),
                                       xmlSchemaNs), iVar1 != 0)))) {
                xmlSchemaParseAttributeGroupDefinition
                          ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                           (xmlNodePtr)schemaLocation);
              }
            }
            else {
              xmlSchemaParseModelGroupDefinition
                        ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                         (xmlNodePtr)schemaLocation);
            }
          }
          else {
            xmlSchemaParseComplexType
                      ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                       (xmlNodePtr)schemaLocation,1);
          }
        }
        else {
          xmlSchemaParseSimpleType
                    ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                     (xmlNodePtr)schemaLocation,1);
        }
      }
      schemaLocation = *(xmlChar **)(schemaLocation + 0x30);
    } while( true );
  }
  if ((((_xmlNode *)schemaLocation != (_xmlNode *)0x0) &&
      (((_xmlNode *)schemaLocation)->ns != (xmlNs *)0x0)) &&
     ((iVar1 = xmlStrEqual(((_xmlNode *)schemaLocation)->name,"annotation"), iVar1 != 0 &&
      (iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(schemaLocation + 0x48) + 0x10),xmlSchemaNs),
      iVar1 != 0)))) {
    schemaLocation = *(xmlChar **)(schemaLocation + 0x30);
  }
LAB_0020ef90:
  if (schemaLocation != (xmlChar *)0x0) {
    wasChameleon = 0xbd9;
    if (child._4_4_ == 3) {
      xmlSchemaPContentErr
                ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                 (xmlSchemaBasicItemPtr)0x0,pxStack_28,(xmlNodePtr)schemaLocation,(char *)0x0,
                 "(annotation | (simpleType | complexType | group | attributeGroup))*");
    }
    else {
      xmlSchemaPContentErr
                ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                 (xmlSchemaBasicItemPtr)0x0,pxStack_28,(xmlNodePtr)schemaLocation,(char *)0x0,
                 "(annotation?)");
    }
  }
  return wasChameleon;
LAB_0020ef1b:
  *(undefined8 *)&schema_local[1].flags = 0;
  *(undefined4 *)((long)&schema_local[1].id + 4) = 0;
  goto LAB_0020ef90;
}

Assistant:

static int
xmlSchemaParseIncludeOrRedefine(xmlSchemaParserCtxtPtr pctxt,
				xmlSchemaPtr schema,
				xmlNodePtr node,
				int type)
{
    xmlNodePtr child = NULL;
    const xmlChar *schemaLocation = NULL;
    int res = 0; /* hasRedefinitions = 0 */
    int isChameleon = 0, wasChameleon = 0;
    xmlSchemaBucketPtr bucket = NULL;

    if ((pctxt == NULL) || (schema == NULL) || (node == NULL))
        return (-1);

    /*
    * Parse attributes. Note that the returned schemaLocation will
    * be already converted to an absolute URI.
    */
    res = xmlSchemaParseIncludeOrRedefineAttrs(pctxt, schema,
	node, (xmlChar **) (&schemaLocation), type);
    if (res != 0)
	return(res);
    /*
    * Load and add the schema document.
    */
    res = xmlSchemaAddSchemaDoc(pctxt, type, schemaLocation, NULL,
	NULL, 0, node, pctxt->targetNamespace, NULL, &bucket);
    if (res != 0)
	return(res);
    /*
    * If we get no schema bucket back, then this means that the schema
    * document could not be located or was broken XML or was not
    * a schema document.
    */
    if ((bucket == NULL) || (bucket->doc == NULL)) {
	if (type == XML_SCHEMA_SCHEMA_INCLUDE) {
	    /*
	    * WARNING for <include>:
	    * We will raise an error if the schema cannot be located
	    * for inclusions, since the that was the feedback from the
	    * schema people. I.e. the following spec piece will *not* be
	    * satisfied:
	    * SPEC src-include: "It is not an error for the `actual value` of the
	    * schemaLocation [attribute] to fail to resolve it all, in which
	    * case no corresponding inclusion is performed.
	    * So do we need a warning report here?"
	    */
	    res = XML_SCHEMAP_SRC_INCLUDE;
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		node, NULL,
		"Failed to load the document '%s' for inclusion",
		schemaLocation, NULL);
	} else {
	    /*
	    * NOTE: This was changed to raise an error even if no redefinitions
	    * are specified.
	    *
	    * SPEC src-redefine (1)
	    * "If there are any element information items among the [children]
	    * other than <annotation> then the `actual value` of the
	    * schemaLocation [attribute] must successfully resolve."
	    * TODO: Ask the WG if a the location has always to resolve
	    * here as well!
	    */
	    res = XML_SCHEMAP_SRC_REDEFINE;
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		node, NULL,
		"Failed to load the document '%s' for redefinition",
		schemaLocation, NULL);
	}
    } else {
	/*
	* Check targetNamespace sanity before parsing the new schema.
	* TODO: Note that we won't check further content if the
	* targetNamespace was bad.
	*/
	if (bucket->origTargetNamespace != NULL) {
	    /*
	    * SPEC src-include (2.1)
	    * "SII has a targetNamespace [attribute], and its `actual
	    * value` is identical to the `actual value` of the targetNamespace
	    * [attribute] of SII' (which must have such an [attribute])."
	    */
	    if (pctxt->targetNamespace == NULL) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    node, NULL,
		    "The target namespace of the included/redefined schema "
		    "'%s' has to be absent, since the including/redefining "
		    "schema has no target namespace",
		    schemaLocation, NULL);
		goto exit_error;
	    } else if (!xmlStrEqual(bucket->origTargetNamespace,
		pctxt->targetNamespace)) {
		/* TODO: Change error function. */
		xmlSchemaPCustomErrExt(pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    NULL, node,
		    "The target namespace '%s' of the included/redefined "
		    "schema '%s' differs from '%s' of the "
		    "including/redefining schema",
		    bucket->origTargetNamespace, schemaLocation,
		    pctxt->targetNamespace);
		goto exit_error;
	    }
	} else if (pctxt->targetNamespace != NULL) {
	    /*
	    * Chameleons: the original target namespace will
	    * differ from the resulting namespace.
	    */
	    isChameleon = 1;
	    if (bucket->parsed &&
		bucket->origTargetNamespace != NULL) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    node, NULL,
		    "The target namespace of the included/redefined schema "
		    "'%s' has to be absent or the same as the "
		    "including/redefining schema's target namespace",
		    schemaLocation, NULL);
		goto exit_error;
	    }
	    bucket->targetNamespace = pctxt->targetNamespace;
	}
    }
    /*
    * Parse the schema.
    */
    if (bucket && (!bucket->parsed) && (bucket->doc != NULL)) {
	if (isChameleon) {
	    /* TODO: Get rid of this flag on the schema itself. */
	    if ((schema->flags & XML_SCHEMAS_INCLUDING_CONVERT_NS) == 0) {
		schema->flags |= XML_SCHEMAS_INCLUDING_CONVERT_NS;
	    } else
		wasChameleon = 1;
	}
	xmlSchemaParseNewDoc(pctxt, schema, bucket);
	/* Restore chameleon flag. */
	if (isChameleon && (!wasChameleon))
	    schema->flags ^= XML_SCHEMAS_INCLUDING_CONVERT_NS;
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (type == XML_SCHEMA_SCHEMA_REDEFINE) {
	/*
	* Parse (simpleType | complexType | group | attributeGroup))*
	*/
	pctxt->redefined = bucket;
	/*
	* How to proceed if the redefined schema was not located?
	*/
	pctxt->isRedefine = 1;
	while (IS_SCHEMA(child, "annotation") ||
	    IS_SCHEMA(child, "simpleType") ||
	    IS_SCHEMA(child, "complexType") ||
	    IS_SCHEMA(child, "group") ||
	    IS_SCHEMA(child, "attributeGroup")) {
	    if (IS_SCHEMA(child, "annotation")) {
		/*
		* TODO: discard or not?
		*/
	    } else if (IS_SCHEMA(child, "simpleType")) {
		xmlSchemaParseSimpleType(pctxt, schema, child, 1);
	    } else if (IS_SCHEMA(child, "complexType")) {
		xmlSchemaParseComplexType(pctxt, schema, child, 1);
		/* hasRedefinitions = 1; */
	    } else if (IS_SCHEMA(child, "group")) {
		/* hasRedefinitions = 1; */
		xmlSchemaParseModelGroupDefinition(pctxt,
		    schema, child);
	    } else if (IS_SCHEMA(child, "attributeGroup")) {
		/* hasRedefinitions = 1; */
		xmlSchemaParseAttributeGroupDefinition(pctxt, schema,
		    child);
	    }
	    child = child->next;
	}
	pctxt->redefined = NULL;
	pctxt->isRedefine = 0;
    } else {
	if (IS_SCHEMA(child, "annotation")) {
	    /*
	    * TODO: discard or not?
	    */
	    child = child->next;
	}
    }
    if (child != NULL) {
	res = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
	if (type == XML_SCHEMA_SCHEMA_REDEFINE) {
	    xmlSchemaPContentErr(pctxt, res,
		NULL, node, child, NULL,
		"(annotation | (simpleType | complexType | group | attributeGroup))*");
	} else {
	     xmlSchemaPContentErr(pctxt, res,
		NULL, node, child, NULL,
		"(annotation?)");
	}
    }
    return(res);

exit_error:
    return(pctxt->err);
}